

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> * __thiscall
tinyusdz::ascii::AsciiParser::ParsePrimMeta
          (optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>
           *__return_storage_ptr__,AsciiParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  value_type *rhs;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  ListEditQual qual;
  string varname;
  MetaVariable var;
  StringData sdata;
  optional<tinyusdz::ascii::AsciiParser::VariableDef> pv;
  string local_1c8;
  ostringstream ss_e;
  MetaVariable local_1a0 [6];
  
  bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
  if (bVar2) {
    qual = ResetToExplicit;
    paVar1 = &sdata.value.field_2;
    sdata.value._M_string_length = 0;
    sdata.value.field_2._M_local_buf[0] = '\0';
    sdata.is_triple_quoted = false;
    sdata.single_quote = false;
    sdata.line_row = 0;
    sdata.line_col = 0;
    sdata.value._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = MaybeTripleQuotedString(this,&sdata);
    if ((bVar2) || (bVar2 = MaybeString(this,&sdata), bVar2)) {
      pv.contained._16_8_ = (long)&pv.contained + 0x20;
      pv.contained._8_8_ = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
      pv.has_value_ = false;
      pv._1_7_ = 0;
      pv.contained._24_8_ = 0;
      pv.contained._32_1_ = 0;
      ::std::__cxx11::string::string((string *)&ss_e,"comment",(allocator *)&var);
      MetaVariable::set_value<tinyusdz::value::StringData>
                ((MetaVariable *)&pv,(string *)&ss_e,&sdata);
      ::std::__cxx11::string::_M_dispose();
      _ss_e = ResetToExplicit;
      MetaVariable::MetaVariable(local_1a0,(MetaVariable *)&pv);
      nonstd::optional_lite::optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::
      optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_0>
                (__return_storage_ptr__,
                 (pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *)&ss_e);
      MetaVariable::~MetaVariable(local_1a0);
      MetaVariable::~MetaVariable((MetaVariable *)&pv);
    }
    else {
      ::std::__cxx11::string::_M_dispose();
      bVar2 = MaybeListEditQual(this,&qual);
      if ((!bVar2) || (bVar2 = SkipWhitespaceAndNewline(this,true), !bVar2)) goto LAB_002c153a;
      varname._M_dataplus._M_p = (pointer)&varname.field_2;
      varname._M_string_length = 0;
      varname.field_2._M_local_buf[0] = '\0';
      bVar2 = ReadIdentifier(this,&varname);
      if (bVar2) {
        bVar2 = IsRegisteredPrimMeta(this,&varname);
        bVar3 = Expect(this,'=');
        if (bVar3) {
          SkipWhitespace(this);
          if (bVar2) {
            GetPrimMetaDefinition
                      ((optional<tinyusdz::ascii::AsciiParser::VariableDef> *)&ss_e,this,&varname);
            nonstd::optional_lite::optional<tinyusdz::ascii::AsciiParser::VariableDef>::
            optional<tinyusdz::ascii::AsciiParser::VariableDef,_0>
                      (&pv,(optional<tinyusdz::ascii::AsciiParser::VariableDef> *)&ss_e);
            nonstd::optional_lite::optional<tinyusdz::ascii::AsciiParser::VariableDef>::~optional
                      ((optional<tinyusdz::ascii::AsciiParser::VariableDef> *)&ss_e);
            if (pv.has_value_ == true) {
              var._name._M_dataplus._M_p = (pointer)&var._name.field_2;
              var._value.v_.vtable =
                   (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
              var._value.v_.storage.dynamic = (void *)0x0;
              var._name._M_string_length = 0;
              var._name.field_2._M_local_buf[0] = '\0';
              rhs = nonstd::optional_lite::optional<tinyusdz::ascii::AsciiParser::VariableDef>::
                    value(&pv);
              VariableDef::VariableDef((VariableDef *)&sdata,rhs);
              bVar2 = ParseMetaValue(this,(VariableDef *)&sdata,&var);
              if (bVar2) {
                ::std::__cxx11::string::_M_assign((string *)&var._name);
                _ss_e = qual;
                MetaVariable::MetaVariable(local_1a0,&var);
                nonstd::optional_lite::
                optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::
                optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_0>
                          (__return_storage_ptr__,
                           (pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *)&ss_e);
                MetaVariable::~MetaVariable(local_1a0);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar4 = ::std::operator<<(poVar4,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar4 = ::std::operator<<(poVar4,":");
                poVar4 = ::std::operator<<(poVar4,"ParsePrimMeta");
                poVar4 = ::std::operator<<(poVar4,"():");
                poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xc4c);
                ::std::operator<<(poVar4," ");
                poVar4 = ::std::operator<<((ostream *)&ss_e,"Failed to parse Prim meta value.");
                ::std::operator<<(poVar4,"\n");
                ::std::__cxx11::stringbuf::str();
                PushError(this,&local_1c8);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                __return_storage_ptr__->has_value_ = false;
                *(undefined8 *)&__return_storage_ptr__->contained = 0;
                *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
                *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
                *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
                *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
                *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
                *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = 0;
                *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = 0;
              }
              VariableDef::~VariableDef((VariableDef *)&sdata);
              MetaVariable::~MetaVariable(&var);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar4 = ::std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar4 = ::std::operator<<(poVar4,":");
              poVar4 = ::std::operator<<(poVar4,"ParsePrimMeta");
              poVar4 = ::std::operator<<(poVar4,"():");
              poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xc55);
              ::std::operator<<(poVar4," ");
              ::std::__cxx11::string::string
                        ((string *)&var,
                         "[Internal error] Unsupported/unimplemented PrimSpec metadata {}",
                         (allocator *)&local_1c8);
              fmt::format<std::__cxx11::string>
                        ((string *)&sdata,(fmt *)&var,(string *)&varname,in_RCX);
              poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&sdata);
              ::std::operator<<(poVar4,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::stringbuf::str();
              PushError(this,&sdata.value);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
              __return_storage_ptr__->has_value_ = false;
              *(undefined8 *)&__return_storage_ptr__->contained = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = 0;
            }
            nonstd::optional_lite::optional<tinyusdz::ascii::AsciiParser::VariableDef>::~optional
                      (&pv);
          }
          else {
            sdata.value._M_string_length = 0;
            sdata.value.field_2._M_local_buf[0] = '\0';
            sdata.value._M_dataplus._M_p = (pointer)paVar1;
            bVar2 = ReadUntilNewline(this,&sdata.value);
            if (bVar2) {
              pv.contained._16_8_ = (long)&pv.contained + 0x20;
              pv.contained._8_8_ = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
              pv.has_value_ = false;
              pv._1_7_ = 0;
              pv.contained._24_8_ = 0;
              pv.contained._32_1_ = 0;
              MetaVariable::set_value<std::__cxx11::string>
                        ((MetaVariable *)&pv,&varname,&sdata.value);
              _ss_e = qual;
              MetaVariable::MetaVariable(local_1a0,(MetaVariable *)&pv);
              nonstd::optional_lite::
              optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::
              optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_0>
                        (__return_storage_ptr__,
                         (pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *)&ss_e);
              MetaVariable::~MetaVariable(local_1a0);
              MetaVariable::~MetaVariable((MetaVariable *)&pv);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar4 = ::std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar4 = ::std::operator<<(poVar4,":");
              poVar4 = ::std::operator<<(poVar4,"ParsePrimMeta");
              poVar4 = ::std::operator<<(poVar4,"():");
              poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xc3f);
              ::std::operator<<(poVar4," ");
              poVar4 = ::std::operator<<((ostream *)&ss_e,
                                         "Failed to parse unregistered Prim metadata.");
              ::std::operator<<(poVar4,"\n");
              ::std::__cxx11::stringbuf::str();
              PushError(this,(string *)&pv);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
              __return_storage_ptr__->has_value_ = false;
              *(undefined8 *)&__return_storage_ptr__->contained = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = 0;
            }
            ::std::__cxx11::string::_M_dispose();
          }
          goto LAB_002c13c8;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ParsePrimMeta");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xc35);
        ::std::operator<<(poVar4," ");
        poVar4 = ::std::operator<<((ostream *)&ss_e,"\'=\' expected in Prim Metadata line.");
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&pv);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      }
      __return_storage_ptr__->has_value_ = false;
      *(undefined8 *)&__return_storage_ptr__->contained = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = 0;
    }
LAB_002c13c8:
    ::std::__cxx11::string::_M_dispose();
  }
  else {
LAB_002c153a:
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<std::pair<ListEditQual, MetaVariable>>
AsciiParser::ParsePrimMeta() {
  if (!SkipCommentAndWhitespaceAndNewline()) {
    return nonstd::nullopt;
  }

  tinyusdz::ListEditQual qual{ListEditQual::ResetToExplicit};

  // May be string only(varname is "comment")
  // For some reason, string-only data is just stored in `MetaVariable` and
  // reconstructed in ReconstructPrimMeta in usda-reader.cc later
  //
  {
    value::StringData sdata;
    if (MaybeTripleQuotedString(&sdata)) {
      MetaVariable var;
      // empty name
      var.set_value("comment", sdata);

      return std::make_pair(qual, var);

    } else if (MaybeString(&sdata)) {
      MetaVariable var;
      var.set_value("comment", sdata);

      return std::make_pair(qual, var);
    }
  }

  if (!MaybeListEditQual(&qual)) {
    return nonstd::nullopt;
  }

  DCOUT("list-edit qual: " << tinyusdz::to_string(qual));

  if (!SkipWhitespaceAndNewline()) {
    return nonstd::nullopt;
  }

  std::string varname;
  if (!ReadIdentifier(&varname)) {
    return nonstd::nullopt;
  }

  DCOUT("Identifier = " << varname);

  bool registered_meta = IsRegisteredPrimMeta(varname);

  if (!Expect('=')) {
    PUSH_ERROR("'=' expected in Prim Metadata line.");
    return nonstd::nullopt;
  }
  SkipWhitespace();

  if (!registered_meta) {
    // parse as string until newline

    std::string content;
    if (!ReadUntilNewline(&content)) {
      PUSH_ERROR("Failed to parse unregistered Prim metadata.");
      return nonstd::nullopt;
    }

    MetaVariable var;
    var.set_value(varname, content);

    return std::make_pair(qual, var);
  } else {
    if (auto pv = GetPrimMetaDefinition(varname)) {
      MetaVariable var;
      const auto vardef = pv.value();
      if (!ParseMetaValue(vardef, &var)) {
        PUSH_ERROR("Failed to parse Prim meta value.");
        return nonstd::nullopt;
      }
      var.set_name(varname);

      return std::make_pair(qual, var);
    } else {
      PUSH_ERROR(fmt::format(
          "[Internal error] Unsupported/unimplemented PrimSpec metadata {}",
          varname));
      return nonstd::nullopt;
    }
  }
}